

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

void __thiscall
duckdb::CopyToFunctionLocalState::~CopyToFunctionLocalState(CopyToFunctionLocalState *this)

{
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__CopyToFunctionLocalState_027b56e0;
  ::std::
  unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
  ::~unique_ptr(&(this->part_buffer_append_state).
                 super_unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
               );
  ::std::
  unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
  ::~unique_ptr(&(this->part_buffer).
                 super_unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
               );
  ::std::unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>::
  ~unique_ptr(&(this->local_state).
               super_unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>
             );
  ::std::unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>::
  ~unique_ptr(&(this->global_state).
               super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
             );
  LocalSinkState::~LocalSinkState(&this->super_LocalSinkState);
  return;
}

Assistant:

explicit CopyToFunctionLocalState(unique_ptr<LocalFunctionData> local_state) : local_state(std::move(local_state)) {
	}